

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O2

ValueType * __thiscall
llbuild::buildsystem::BuildValue::toData(ValueType *__return_storage_ptr__,BuildValue *this)

{
  Kind KVar1;
  FileInfo *value;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  uint32_t i;
  uint n;
  BinaryEncoder coder;
  BinaryEncoder local_130;
  
  local_130.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX =
       &local_130.encdata.super_SmallVectorStorage<unsigned_char,_256U>;
  local_130.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size = 0;
  local_130.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity = 0x100;
  llbuild::basic::BinaryCodingTraits<llbuild::buildsystem::BuildValue::Kind>::encode
            (&this->kind,&local_130);
  KVar1 = this->kind;
  __buf = extraout_RDX;
  if ((KVar1 < (FilteredDirectoryContents|ExistingInput)) &&
     ((0x20060U >> (KVar1 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    llbuild::basic::BinaryCodingTraits<llbuild::basic::CommandSignature>::encode
              (&this->signature,&local_130);
    KVar1 = this->kind;
    __buf = extraout_RDX_00;
  }
  if ((KVar1 < (FilteredDirectoryContents|ExistingInput)) &&
     ((0x20414U >> (KVar1 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    llbuild::basic::BinaryEncoder::write(&local_130,this->numOutputInfos,__buf,0x20414);
    for (n = 0; n != this->numOutputInfos; n = n + 1) {
      value = getNthOutputInfo(this,n);
      llbuild::basic::BinaryCodingTraits<llbuild::basic::FileInfo>::encode(value,&local_130);
    }
    KVar1 = this->kind;
  }
  if ((KVar1 < SuccessfulCommandWithOutputSignature) &&
     ((0x10090U >> (KVar1 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    llbuild::basic::StringList::encode(&this->stringValues,&local_130);
  }
  llbuild::basic::BinaryEncoder::contents(__return_storage_ptr__,&local_130);
  llvm::SmallVectorImpl<unsigned_char>::~SmallVectorImpl
            ((SmallVectorImpl<unsigned_char> *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

inline core::ValueType buildsystem::BuildValue::toData() const {
  basic::BinaryEncoder coder;
  coder.write(kind);
  if (kindHasSignature())
    coder.write(signature);
  if (kindHasOutputInfo()) {
    coder.write(numOutputInfos);
    for (uint32_t i = 0; i != numOutputInfos; ++i) {
      coder.write(getNthOutputInfo(i));
    }
  }
  if (kindHasStringList()) {
    stringValues.encode(coder);
  }
  return coder.contents();
}